

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

bool __thiscall
nuraft::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  int32_t my_id;
  bool bVar1;
  type tVar2;
  __int_type_conflict leader_id;
  int iVar3;
  srv_role sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  element_type *peVar8;
  snapshot *psVar9;
  element_type *peVar10;
  buffer *pbVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  raft_server *this_00;
  element_type *peVar15;
  element_type *peVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined4 extraout_var_00;
  snapshot_sync_req *in_RSI;
  long in_RDI;
  char *pcVar19;
  ptr<snapshot> new_snp;
  ptr<cluster_config> c_conf;
  ExecAutoResume exec_auto_resume;
  size_t wait_count;
  buffer *buf;
  ulong obj_id;
  CbReturnCode rc;
  Param param;
  bool is_last_obj;
  bool is_first_obj;
  ptr<cluster_config> *in_stack_00000640;
  raft_server *in_stack_00000648;
  char *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  Type in_stack_fffffffffffffb24;
  raft_server *in_stack_fffffffffffffb28;
  raft_server *in_stack_fffffffffffffb30;
  raft_server *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffb50;
  raft_server *in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffbe8;
  raft_server *in_stack_fffffffffffffbf0;
  string local_240 [32];
  string local_220 [39];
  type local_1f9;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [108];
  int local_f4;
  duration<long,std::ratio<1l,1000l>> local_f0 [8];
  string local_e8 [32];
  long local_c8;
  buffer *local_c0;
  ulong local_b8;
  string local_b0 [36];
  ReturnCode local_8c;
  Param local_88;
  string local_70 [32];
  string local_50 [35];
  byte local_2d;
  byte local_19;
  snapshot_sync_req *local_18;
  byte local_1;
  undefined4 extraout_var;
  
  local_18 = in_RSI;
  uVar6 = snapshot_sync_req::get_offset(in_RSI);
  local_19 = uVar6 == 0;
  local_2d = snapshot_sync_req::is_done(local_18);
  if (((local_19 & 1) != 0) || ((bool)local_2d)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ae8b0);
      iVar3 = (*peVar8->_vptr_logger[7])();
      if (3 < iVar3) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ae8e9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1ae8fe);
        uVar6 = snapshot::get_last_log_idx(psVar9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1ae92c);
        uVar17 = snapshot::get_last_log_term(psVar9);
        uVar7 = snapshot_sync_req::get_offset(local_18);
        in_stack_fffffffffffffb18 = "";
        pcVar19 = "";
        if ((local_19 & 1) != 0) {
          pcVar19 = "first obj";
        }
        if ((local_2d & 1) != 0) {
          in_stack_fffffffffffffb18 = "last obj";
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_50,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",uVar6,
                   uVar17,uVar7,pcVar19);
        (*peVar8->_vptr_logger[8])
                  (peVar8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1d8,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1aea8a);
      iVar3 = (*peVar8->_vptr_logger[7])();
      if (4 < iVar3) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1aeac3);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1aead8);
        uVar6 = snapshot::get_last_log_idx(psVar9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1aeb06);
        uVar17 = snapshot::get_last_log_term(psVar9);
        uVar7 = snapshot_sync_req::get_offset(local_18);
        in_stack_fffffffffffffb18 = "";
        pcVar19 = "";
        if ((local_19 & 1) != 0) {
          pcVar19 = "first obj";
        }
        if ((local_2d & 1) != 0) {
          in_stack_fffffffffffffb18 = "last obj";
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_70,"save snapshot (idx %lu, term %lu) offset 0x%lx, %s %s",uVar6,
                   uVar17,uVar7,pcVar19);
        (*peVar8->_vptr_logger[8])
                  (peVar8,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1e1,local_70);
        std::__cxx11::string::~string(local_70);
      }
    }
  }
  my_id = *(int32_t *)(in_RDI + 0x38);
  leader_id = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffb28);
  cb_func::Param::Param(&local_88,my_id,leader_id,-1,(void *)0x0);
  local_88.ctx = local_18;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1aec78);
  local_8c = cb_func::call((cb_func *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb24,
                           (Param *)in_stack_fffffffffffffb18);
  if (local_8c == ReturnNull) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1aece7);
      iVar3 = (*peVar8->_vptr_logger[7])();
      if (2 < iVar3) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1aed20);
        msg_if_given_abi_cxx11_((char *)local_b0,"by callback, return false");
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_snapshot_sync_req",0x1e8,local_b0);
        std::__cxx11::string::~string(local_b0);
      }
    }
    local_1 = 0;
  }
  else {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffb30,
               (__int_type)in_stack_fffffffffffffb28);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffb28);
    if (!bVar1) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
    }
    psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1aee1f);
    tVar2 = snapshot::get_type(psVar9);
    if (tVar2 == raw_binary) {
      peVar10 = std::
                __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1aee66);
      psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1aee7b);
      uVar6 = snapshot_sync_req::get_offset(local_18);
      pbVar11 = snapshot_sync_req::get_data((snapshot_sync_req *)0x1aeea9);
      (*peVar10->_vptr_state_machine[10])(peVar10,psVar9,uVar6,pbVar11);
    }
    else {
      local_b8 = snapshot_sync_req::get_offset(local_18);
      local_c0 = snapshot_sync_req::get_data((snapshot_sync_req *)0x1aef17);
      buffer::pos((buffer *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                  (size_t)in_stack_fffffffffffffb38);
      peVar10 = std::
                __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1aef58);
      psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1aef6d);
      (*peVar10->_vptr_state_machine[0xb])
                (peVar10,psVar9,&local_b8,local_c0,(ulong)(local_19 & 1),(ulong)(local_2d & 1));
      snapshot_sync_req::set_offset(local_18,local_b8);
    }
    if ((local_2d & 1) != 0) {
      pause_state_machine_exeuction(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_c8 = 0;
      while (bVar1 = wait_for_state_machine_pause
                               (in_stack_fffffffffffffb28,
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1af060);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (3 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1af099);
            local_c8 = local_c8 + 1;
            msg_if_given_abi_cxx11_
                      ((char *)local_e8,
                       "waiting for state machine pause before applying snapshot: count %zu");
            (*peVar8->_vptr_logger[8])
                      (peVar8,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x20f,local_e8);
            std::__cxx11::string::~string(local_e8);
          }
        }
      }
      while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffb28),
            bVar1) {
        local_f4 = 500;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_f0,&local_f4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffb50);
      }
      std::function<void()>::
      function<nuraft::raft_server::handle_snapshot_sync_req(nuraft::snapshot_sync_req&)::__0,void>
                ((function<void_()> *)in_stack_fffffffffffffb30,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffb28);
      handle_snapshot_sync_req(nuraft::snapshot_sync_req&)::ExecAutoResume::ExecAutoResume(std::
      function<void()>_((ExecAutoResume *)
                        CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                        (function<void_()> *)in_stack_fffffffffffffb18);
      std::function<void_()>::~function((function<void_()> *)0x1af1da);
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
      sVar4 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1af204);
      if (sVar4 != follower) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1af23e);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (1 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1af277);
            msg_if_given_abi_cxx11_
                      ((char *)local_160,
                       "bad server role for applying a snapshot, exit for debugging");
            (*peVar8->_vptr_logger[8])
                      (peVar8,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x220,local_160);
            std::__cxx11::string::~string(local_160);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1af353);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1af35b);
        (*peVar12->_vptr_state_mgr[8])(peVar12,0xfffffff5);
        exit(-1);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1af3a9);
        iVar3 = (*peVar8->_vptr_logger[7])();
        if (3 < iVar3) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1af3e2);
          psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af3f7);
          uVar6 = snapshot::get_last_log_idx(psVar9);
          psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af425);
          uVar17 = snapshot::get_last_log_term(psVar9);
          msg_if_given_abi_cxx11_
                    ((char *)local_180,
                     "successfully receive a snapshot (idx %lu term %lu) from leader",uVar6,uVar17);
          (*peVar8->_vptr_logger[8])
                    (peVar8,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_snapshot_sync_req",0x229,local_180);
          std::__cxx11::string::~string(local_180);
        }
      }
      peVar13 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1af4eb);
      psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af500);
      uVar6 = snapshot::get_last_log_idx(psVar9);
      uVar5 = (*peVar13->_vptr_log_store[0xe])(peVar13,uVar6);
      if ((uVar5 & 1) == 0) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1afd50);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (1 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1afd83);
            msg_if_given_abi_cxx11_
                      ((char *)local_240,
                       "failed to compact the log store after a snapshot is received, will ask the leader to retry"
                      );
            (*peVar8->_vptr_logger[8])
                      (peVar8,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x25a,local_240);
            std::__cxx11::string::~string(local_240);
          }
        }
        local_1 = 0;
        bVar1 = true;
      }
      else {
        stop_election_timer(in_stack_fffffffffffffb60);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1af593);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (3 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1af5cc);
            msg_if_given_abi_cxx11_
                      ((char *)local_1a0,
                       "successfully compact the log store, will now ask the statemachine to apply the snapshot"
                      );
            (*peVar8->_vptr_logger[8])
                      (peVar8,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x231,local_1a0);
            std::__cxx11::string::~string(local_1a0);
          }
        }
        peVar10 = std::
                  __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1af669);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af67e);
        uVar5 = (*peVar10->_vptr_state_machine[0xc])(peVar10,psVar9);
        if ((uVar5 & 1) == 0) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1af6ec);
            iVar3 = (*peVar8->_vptr_logger[7])();
            if (1 < iVar3) {
              peVar8 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1af725);
              msg_if_given_abi_cxx11_
                        ((char *)local_1c0,
                         "failed to apply the snapshot after log compacted, to ensure the safety, will shutdown the system"
                        );
              (*peVar8->_vptr_logger[8])
                        (peVar8,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                         ,"handle_snapshot_sync_req",0x235,local_1c0);
              std::__cxx11::string::~string(local_1c0);
            }
          }
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1af7c2)
          ;
          peVar12 = std::
                    __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1af7ca);
          (*peVar12->_vptr_state_mgr[8])(peVar12,0xfffffff4);
          exit(-1);
        }
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af7f4);
        snapshot::get_last_config(psVar9);
        reconfigure(in_stack_00000648,in_stack_00000640);
        get_config(in_stack_fffffffffffffb38);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1af857);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1af85f);
        peVar14 = std::
                  __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*peVar12->_vptr_state_mgr[3])(peVar12,peVar14);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af897);
        snapshot::get_last_log_idx(psVar9);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffb30,
                   (__int_type)in_stack_fffffffffffffb28);
        this_00 = (raft_server *)snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af8e1);
        snapshot::get_last_log_idx((snapshot *)this_00);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffb30,
                   (__int_type)in_stack_fffffffffffffb28);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af92b);
        snapshot::get_last_log_idx(psVar9);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffb30,
                   (__int_type)in_stack_fffffffffffffb28);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1af975);
        snapshot::get_last_log_idx(psVar9);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffb30,
                   (__int_type)in_stack_fffffffffffffb28);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1af9c6);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1af9ce);
        peVar15 = std::
                  __shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*peVar12->_vptr_state_mgr[4])(peVar12,peVar15);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1afa0d);
        local_1e8 = snapshot::get_last_log_idx(psVar9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1afa4b);
        local_1f0 = snapshot::get_last_log_term(psVar9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1afa83);
        local_1f8 = snapshot::size(psVar9);
        psVar9 = snapshot_sync_req::get_snapshot((snapshot_sync_req *)0x1afab5);
        local_1f9 = snapshot::get_type(psVar9);
        cs_new<nuraft::snapshot,unsigned_long,unsigned_long,std::shared_ptr<nuraft::cluster_config>&,unsigned_long,nuraft::snapshot::type>
                  ((unsigned_long *)in_stack_fffffffffffffb38,
                   (unsigned_long *)in_stack_fffffffffffffb30,
                   (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffb28,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                   (type *)in_stack_fffffffffffffb18);
        set_last_snapshot(in_stack_fffffffffffffb30,(ptr<snapshot> *)in_stack_fffffffffffffb28);
        restart_election_timer(this_00);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1afb65);
          iVar3 = (*peVar8->_vptr_logger[7])();
          if (3 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1afb98);
            peVar16 = std::
                      __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1afbaa);
            uVar6 = snapshot::get_last_log_idx(peVar16);
            peVar16 = std::
                      __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1afbc6);
            uVar17 = snapshot::get_last_log_term(peVar16);
            peVar13 = std::
                      __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1afbe9);
            iVar3 = (*peVar13->_vptr_log_store[3])();
            uVar18 = CONCAT44(extraout_var,iVar3);
            peVar13 = std::
                      __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1afc10);
            iVar3 = (*peVar13->_vptr_log_store[2])();
            msg_if_given_abi_cxx11_
                      ((char *)local_220,
                       "snapshot idx %lu term %lu is successfully applied, log start %lu last idx %lu"
                       ,uVar6,uVar17,uVar18,CONCAT44(extraout_var_00,iVar3) + -1);
            (*peVar8->_vptr_logger[8])
                      (peVar8,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_snapshot_sync_req",0x256,local_220);
            std::__cxx11::string::~string(local_220);
          }
        }
        std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1afcee);
        std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                  ((shared_ptr<nuraft::cluster_config> *)0x1afcfb);
        bVar1 = false;
      }
      handle_snapshot_sync_req::ExecAutoResume::~ExecAutoResume
                ((ExecAutoResume *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      if (bVar1) goto LAB_001affa7;
    }
    local_1 = 1;
  }
LAB_001affa7:
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req) {
 try {
    // if offset == 0, it is the first object.
    bool is_first_obj = (req.get_offset()) ? false : true;
    bool is_last_obj = req.is_done();
    if (is_first_obj || is_last_obj) {
        // INFO level: log only first and last object.
        p_in("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    } else {
        // above DEBUG: log all.
        p_db("save snapshot (idx %" PRIu64 ", term %" PRIu64 ") offset 0x%" PRIx64
             ", %s %s",
             req.get_snapshot().get_last_log_idx(),
             req.get_snapshot().get_last_log_term(),
             req.get_offset(),
             (is_first_obj) ? "first obj" : "",
             (is_last_obj)  ? "last obj"  : "" );
    }

    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::SaveSnapshot, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return false");
        return false;
    }

    // Set flag to avoid initiating election by this node.
    receiving_snapshot_ = true;
    et_cnt_receiving_snapshot_ = 0;

    // Set initialized flag
    if (!initialized_) initialized_ = true;

    if (req.get_snapshot().get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary type (original).
        state_machine_->save_snapshot_data(req.get_snapshot(),
                                           req.get_offset(),
                                           req.get_data());
        // LCOV_EXCL_STOP

    } else {
        // Logical object type.
        ulong obj_id = req.get_offset();
        buffer& buf = req.get_data();
        buf.pos(0);
        state_machine_->save_logical_snp_obj(req.get_snapshot(),
                                             obj_id,
                                             buf,
                                             is_first_obj,
                                             is_last_obj);
        req.set_offset(obj_id);
    }

    if (is_last_obj) {
        // let's pause committing in backgroud so it doesn't access logs
        // while they are being compacted
        pause_state_machine_exeuction();
        size_t wait_count = 0;
        while (!wait_for_state_machine_pause(500)) {
            p_in("waiting for state machine pause before applying snapshot: count %zu",
                 ++wait_count);
        }
        while (sm_commit_exec_in_progress_)
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

        struct ExecAutoResume {
            explicit ExecAutoResume(std::function<void()> func) : clean_func_(func) {}
            ~ExecAutoResume() { clean_func_(); }
            std::function<void()> clean_func_;
        } exec_auto_resume([this](){ resume_state_machine_execution(); });


        receiving_snapshot_ = false;

        // Only follower will run this piece of code, but let's check it again
        if (role_ != srv_role::follower) {
            // LCOV_EXCL_START
            p_er("bad server role for applying a snapshot, exit for debugging");
            ctx_->state_mgr_->system_exit(raft_err::N11_not_follower_for_snapshot);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        p_in( "successfully receive a snapshot (idx %" PRIu64 " term %" PRIu64
              ") from leader",
              req.get_snapshot().get_last_log_idx(),
              req.get_snapshot().get_last_log_term() );
        if (log_store_->compact(req.get_snapshot().get_last_log_idx())) {
            // The state machine will not be able to commit anything before the
            // snapshot is applied, so make this synchronously with election
            // timer stopped as usually applying a snapshot may take a very
            // long time
            stop_election_timer();
            p_in("successfully compact the log store, will now ask the "
                 "statemachine to apply the snapshot");
            if (!state_machine_->apply_snapshot(req.get_snapshot())) {
                // LCOV_EXCL_START
                p_er("failed to apply the snapshot after log compacted, "
                     "to ensure the safety, will shutdown the system");
                ctx_->state_mgr_->system_exit(raft_err::N12_apply_snapshot_failed);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }

            reconfigure(req.get_snapshot().get_last_config());

            ptr<cluster_config> c_conf = get_config();
            ctx_->state_mgr_->save_config(*c_conf);

            precommit_index_ = req.get_snapshot().get_last_log_idx();
            sm_commit_index_ = req.get_snapshot().get_last_log_idx();
            quick_commit_index_ = req.get_snapshot().get_last_log_idx();
            lagging_sm_target_index_ = req.get_snapshot().get_last_log_idx();

            ctx_->state_mgr_->save_state(*state_);

            ptr<snapshot> new_snp = cs_new<snapshot>
                                    ( req.get_snapshot().get_last_log_idx(),
                                      req.get_snapshot().get_last_log_term(),
                                      c_conf,
                                      req.get_snapshot().size(),
                                      req.get_snapshot().get_type() );
            set_last_snapshot(new_snp);

            restart_election_timer();
            p_in("snapshot idx %" PRIu64 " term %" PRIu64 " is successfully applied, "
                 "log start %" PRIu64 " last idx %" PRIu64,
                 new_snp->get_last_log_idx(),
                 new_snp->get_last_log_term(),
                 log_store_->start_index(),
                 log_store_->next_slot() - 1);

        } else {
            p_er("failed to compact the log store after a snapshot is received, "
                 "will ask the leader to retry");
            return false;
        }
    }

 } catch (...) {
    // LCOV_EXCL_START
    p_er("failed to handle snapshot installation due to system errors");
    ctx_->state_mgr_->system_exit(raft_err::N13_snapshot_install_failed);
    ::exit(-1);
    return false;
    // LCOV_EXCL_STOP
 }

    return true;
}